

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

bool __thiscall GameEngine::isPopulationExist(GameEngine *this,size_t posX,size_t posY)

{
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar1;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  pvVar1 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           posY);
  CellType::getCurrentPopulation
            ((pvVar1->
             super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
             )._M_impl.super__Vector_impl_data._M_start[posX].
             super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return local_20 != 0;
}

Assistant:

bool GameEngine::isPopulationExist(size_t posX, size_t posY) {
  return (*map)[posY][posX]->getCurrentPopulation() != nullptr;
}